

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::MultiNode
          (MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this,
          MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *other)

{
  Data *pDVar1;
  Chain *pCVar2;
  Chain **ppCVar3;
  Chain *pCVar4;
  
  this->key = other->key;
  pCVar4 = other->value;
  if (pCVar4 != (Chain *)0x0) {
    ppCVar3 = &this->value;
    do {
      pCVar2 = (Chain *)operator_new(0x38);
      (pCVar2->value).texId = (pCVar4->value).texId;
      pDVar1 = (pCVar4->value).stops.d.d;
      (pCVar2->value).stops.d.d = pDVar1;
      (pCVar2->value).stops.d.ptr = (pCVar4->value).stops.d.ptr;
      (pCVar2->value).stops.d.size = (pCVar4->value).stops.d.size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      (pCVar2->value).interpolationMode = (pCVar4->value).interpolationMode;
      (pCVar2->value).opacity = (pCVar4->value).opacity;
      pCVar2->next = (MultiNodeChain<QOpenGL2GradientCache::CacheInfo> *)0x0;
      *ppCVar3 = pCVar2;
      ppCVar3 = &pCVar2->next;
      pCVar4 = pCVar4->next;
    } while (pCVar4 != (MultiNodeChain<QOpenGL2GradientCache::CacheInfo> *)0x0);
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }